

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>::Matcher
          (Matcher<const_phmap::priv::hash_internal::EnumClass_&> *this,EnumClass *value)

{
  ComparisonBase<testing::internal::EqMatcher<phmap::priv::hash_internal::EnumClass>,_phmap::priv::hash_internal::EnumClass,_std::equal_to<void>_>
  local_38;
  Matcher<const_phmap::priv::hash_internal::EnumClass_&> local_30;
  EnumClass *local_18;
  EnumClass *value_local;
  Matcher<const_phmap::priv::hash_internal::EnumClass_&> *this_local;
  
  local_18 = value;
  value_local = (EnumClass *)this;
  internal::MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>::MatcherBase
            (&this->super_MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>);
  (this->super_MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_003482d0;
  local_38.rhs_ = (EnumClass)Eq<phmap::priv::hash_internal::EnumClass>(*local_18);
  Matcher<phmap::priv::hash_internal::EnumClass_const&>::
  Matcher<testing::internal::EqMatcher<phmap::priv::hash_internal::EnumClass>,void>
            ((Matcher<phmap::priv::hash_internal::EnumClass_const&> *)&local_30,
             (EqMatcher<phmap::priv::hash_internal::EnumClass> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}